

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polynomial.cc
# Opt level: O1

vector<double,_std::allocator<double>_> *
gmath::realRoots(vector<double,_std::allocator<double>_> *__return_storage_ptr__,Polynomiald *p)

{
  long lVar1;
  int iVar2;
  int hn;
  long lVar3;
  long lVar4;
  iterator iVar5;
  double dVar6;
  double dVar7;
  SturmChaind s;
  SturmChain<double> local_38;
  double local_28;
  
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar2 = p->used;
  if (iVar2 == 3) {
    local_28 = p->c[1] * p->c[1] + p->c[2] * -4.0 * *p->c;
    if (local_28 <= 0.0) {
      if (local_28 != 0.0) {
        return __return_storage_ptr__;
      }
      if (NAN(local_28)) {
        return __return_storage_ptr__;
      }
      local_38._0_8_ = -p->c[1] / (p->c[2] + p->c[2]);
      iVar5._M_current =
           (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar5._M_current ==
          (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  (__return_storage_ptr__,iVar5,(double *)&local_38);
        return __return_storage_ptr__;
      }
      *iVar5._M_current = (double)local_38._0_8_;
      goto LAB_0010f45b;
    }
    if (local_28 < 0.0) {
      local_28 = sqrt(local_28);
    }
    else {
      local_28 = SQRT(local_28);
    }
    dVar6 = 0.0;
    if (1 < p->used) {
      dVar6 = p->c[1];
    }
    local_38._0_8_ = 0.0;
    if (2 < p->used) {
      local_38._0_8_ = p->c[2] + p->c[2];
    }
    local_38._0_8_ = (local_28 - dVar6) / (double)local_38._0_8_;
    iVar5._M_current =
         (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar5._M_current ==
        (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                (__return_storage_ptr__,iVar5,(double *)&local_38);
    }
    else {
      *iVar5._M_current = (double)local_38._0_8_;
      (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
      super__Vector_impl_data._M_finish = iVar5._M_current + 1;
    }
    local_38._0_8_ = 0.0;
    dVar6 = 0.0;
    if (1 < p->used) {
      dVar6 = p->c[1];
    }
    if (2 < p->used) {
      local_38._0_8_ = p->c[2] + p->c[2];
    }
    local_38._0_8_ = (-dVar6 - local_28) / (double)local_38._0_8_;
    iVar5._M_current =
         (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar5._M_current ==
        (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                (__return_storage_ptr__,iVar5,(double *)&local_38);
      return __return_storage_ptr__;
    }
  }
  else {
    if (iVar2 != 2) {
      if (iVar2 < 4) {
        return __return_storage_ptr__;
      }
      SturmChain<double>::SturmChain(&local_38,p);
      iVar2 = SturmChain<double>::countSignChangesNegInf(&local_38);
      hn = SturmChain<double>::countSignChangesPosInf(&local_38);
      if (hn < iVar2) {
        lVar3 = (long)p->used;
        dVar6 = 0.0;
        if (1 < lVar3) {
          lVar4 = lVar3;
          do {
            lVar1 = lVar4 + -1;
            dVar7 = 0.0;
            if (lVar1 <= lVar3) {
              dVar7 = p->c[lVar4 + -2];
            }
            dVar6 = dVar6 + ABS(dVar7);
            lVar4 = lVar1;
          } while (1 < lVar1);
        }
        dVar6 = dVar6 / ABS(p->c[lVar3 + -1]);
        if (dVar6 <= 1.0) {
          dVar6 = 1.0;
        }
        dVar6 = dVar6 * 1e-12 + dVar6;
        anon_unknown_3::findRoots(__return_storage_ptr__,&local_38,-dVar6,dVar6,iVar2,hn);
      }
      SturmChain<double>::~SturmChain(&local_38);
      return __return_storage_ptr__;
    }
    local_38._0_8_ = -*p->c / p->c[1];
    iVar5._M_current =
         (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar5._M_current ==
        (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                (__return_storage_ptr__,iVar5,(double *)&local_38);
      return __return_storage_ptr__;
    }
  }
  *iVar5._M_current = (double)local_38._0_8_;
LAB_0010f45b:
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_finish = iVar5._M_current + 1;
  return __return_storage_ptr__;
}

Assistant:

std::vector<double> realRoots(const Polynomiald &p)
{
  std::vector<double> ret;

  // call direct solution, if the degree is <= 3

  if (p.getDegree() == 1) // compute solution to first degree in closed form
  {
    ret.push_back(-p[0]/p[1]);
  }
  else if (p.getDegree() == 2) // compute solution to second degree in closed form
  {
    double v;

    v=p[1]*p[1]-4*p[2]*p[0];

    if (v > 0)
    {
      v=sqrt(v);

      ret.push_back((-p[1]+v)/(2*p[2]));
      ret.push_back((-p[1]-v)/(2*p[2]));
    }
    else if (v == 0)
    {
      ret.push_back(-p[1]/(2*p[2]));
    }
  }
  else if (p.getDegree() > 2) // compute solutions of higher degrees using Sturm chains
  {
    SturmChaind s(p);
    int ln=s.countSignChangesNegInf();
    int hn=s.countSignChangesPosInf();

    if (ln-hn > 0)
    {
      // determine radius around the origin that contains all roots using
      // Gerschgorins theorem

      double r=0;

      int i=p.getDegree()-1;
      if (i >= 0)
      {
        while (i >= 0)
        {
          r+=std::abs(p[i]);
          i--;
        }
      }

      r/=std::abs(p[p.getDegree()]);
      r=std::max(1.0, r);
      r+=r*1e-12;

      // recursively determine all roots

      findRoots(ret, s, -r, r, ln, hn);
    }
  }

  return ret;
}